

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O1

unique_ptr<Catch::ColourImpl> __thiscall
Catch::makeColourImpl(Catch *this,ColourMode implSelection,IStream *stream)

{
  int iVar1;
  int *piVar2;
  undefined8 *puVar3;
  int iVar4;
  undefined7 in_register_00000031;
  undefined **ppuVar5;
  ReusableStringStream local_60;
  string local_50;
  
  ppuVar5 = &PTR__ColourImpl_00326720;
  iVar4 = (int)CONCAT71(in_register_00000031,implSelection);
  if (iVar4 == 0) {
    iVar1 = (*stream->_vptr_IStream[3])(stream);
    piVar2 = __errno_location();
    iVar4 = *piVar2;
    if ((char)iVar1 == '\0') {
      *piVar2 = iVar4;
    }
    else {
      iVar1 = isatty(1);
      *piVar2 = iVar4;
      if (iVar1 != 0) goto LAB_00144c4c;
    }
  }
  else {
    if (iVar4 == 1) goto LAB_00144c4c;
    if (iVar4 != 3) {
      ReusableStringStream::ReusableStringStream(&local_60);
      std::__ostream_insert<char,std::char_traits<char>>
                (local_60.m_oss,"Could not create colour impl for selection ",0x2b);
      std::ostream::operator<<(local_60.m_oss,(uint)implSelection);
      std::__cxx11::stringbuf::str();
      throw_domain_error(&local_50);
    }
  }
  ppuVar5 = &PTR__ColourImpl_00326760;
LAB_00144c4c:
  puVar3 = (undefined8 *)operator_new(0x10);
  puVar3[1] = stream;
  *puVar3 = ppuVar5;
  *(undefined8 **)this = puVar3;
  return (unique_ptr<Catch::ColourImpl>)(ColourImpl *)this;
}

Assistant:

Detail::unique_ptr<ColourImpl> makeColourImpl( ColourMode implSelection,
                                                   IStream* stream ) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
        if ( implSelection == ColourMode::Win32 ) {
            return Detail::make_unique<Win32ColourImpl>( stream );
        }
#endif
        if ( implSelection == ColourMode::ANSI ) {
            return Detail::make_unique<ANSIColourImpl>( stream );
        }
        if ( implSelection == ColourMode::None ) {
            return Detail::make_unique<NoColourImpl>( stream );
        }

        if ( implSelection == ColourMode::PlatformDefault) {
#if defined( CATCH_CONFIG_COLOUR_WIN32 )
            if ( Win32ColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<Win32ColourImpl>( stream );
            }
#endif
            if ( ANSIColourImpl::useImplementationForStream( *stream ) ) {
                return Detail::make_unique<ANSIColourImpl>( stream );
            }
            return Detail::make_unique<NoColourImpl>( stream );
        }

        CATCH_ERROR( "Could not create colour impl for selection " << static_cast<int>(implSelection) );
    }